

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_199c2b::ShellTool::configureAttribute
          (ShellTool *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  Child CVar1;
  Child CVar2;
  Child CVar3;
  Child CVar4;
  bool bVar5;
  Child CVar6;
  NodeKind NVar7;
  Child LHS;
  Child CVar8;
  Child local_f8 [2];
  undefined2 local_e8;
  undefined6 uStack_e6;
  Child local_d8 [2];
  undefined2 local_c8;
  undefined6 uStack_c6;
  Twine local_b8;
  undefined4 local_98;
  undefined4 uStack_94;
  NodeKind local_88;
  char cStack_87;
  undefined6 uStack_86;
  uint local_80;
  undefined4 uStack_7c;
  NodeKind local_70;
  char cStack_6f;
  undefined6 uStack_6e;
  uint local_68;
  undefined4 uStack_64;
  NodeKind local_58;
  char cStack_57;
  undefined6 uStack_56;
  StringRef local_50;
  uint local_40;
  undefined4 uStack_3c;
  NodeKind local_30;
  char cStack_2f;
  undefined6 uStack_2e;
  StringRef local_28;
  
  local_50.Length = name.Length;
  local_50.Data = name.Data;
  local_28.Length = value.Length;
  local_28.Data = value.Data;
  if ((local_50.Length == 0xf) &&
     (*(long *)((long)local_50.Data + 7) == 0x64656c62616e652d &&
      *(long *)local_50.Data == 0x2d6c6f72746e6f63)) {
    if (local_28.Length == 5) {
      if ((char)*(int *)((long)local_28.Data + 4) != 'e' || *(int *)local_28.Data != 0x736c6166)
      goto LAB_0013c954;
      bVar5 = false;
    }
    else {
      if ((local_28.Length != 4) || (*(int *)local_28.Data != 0x65757274)) {
LAB_0013c954:
        llvm::Twine::Twine((Twine *)&local_40,"invalid value: \'",&local_28);
        llvm::Twine::Twine((Twine *)&local_68,"\' for attribute \'");
        if ((local_30 == NullKind) || (local_58 == NullKind)) {
          local_e8 = 0x100;
        }
        else if (local_30 == EmptyKind) {
          local_e8._1_1_ = cStack_57;
          local_e8._0_1_ = local_58;
          uStack_e6 = uStack_56;
          local_f8[0]._0_4_ = local_68;
          local_f8[0]._4_4_ = uStack_64;
        }
        else if (local_58 == EmptyKind) {
          local_e8._1_1_ = cStack_2f;
          local_e8._0_1_ = local_30;
          uStack_e6 = uStack_2e;
          local_f8[0]._0_4_ = local_40;
          local_f8[0]._4_4_ = uStack_3c;
        }
        else {
          CVar6._4_4_ = uStack_3c;
          CVar6.decUI = local_40;
          if (cStack_2f != '\x01') {
            local_30 = TwineKind;
            CVar6.twine = (Twine *)&local_40;
          }
          if (cStack_57 != '\x01') {
            local_58 = TwineKind;
          }
          CVar4._4_4_ = uStack_64;
          CVar4.decUI = local_68;
          CVar8.twine = (Twine *)&local_68;
          if (cStack_57 == '\x01') {
            CVar8 = CVar4;
          }
          llvm::Twine::Twine((Twine *)local_f8,CVar6,local_30,CVar8,local_58);
        }
        llvm::Twine::Twine((Twine *)&local_80,&local_50);
        if (((NodeKind)local_e8 == NullKind) || (local_70 == NullKind)) {
          local_c8 = 0x100;
        }
        else if ((NodeKind)local_e8 == EmptyKind) {
          local_c8._1_1_ = cStack_6f;
          local_c8._0_1_ = local_70;
          uStack_c6 = uStack_6e;
          local_d8[0]._0_4_ = local_80;
          local_d8[0]._4_4_ = uStack_7c;
        }
        else if (local_70 == EmptyKind) {
          local_c8._0_1_ = (NodeKind)local_e8;
          local_c8._1_1_ = local_e8._1_1_;
          uStack_c6 = uStack_e6;
          local_d8[0].decUI = local_f8[0].decUI;
          local_d8[0]._4_4_ = local_f8[0]._4_4_;
        }
        else {
          CVar8._4_4_ = local_f8[0]._4_4_;
          CVar8.decUI = local_f8[0].decUI;
          NVar7 = (NodeKind)local_e8;
          if (local_e8._1_1_ != EmptyKind) {
            CVar8.twine = (Twine *)local_f8;
            NVar7 = TwineKind;
          }
          if (cStack_6f != '\x01') {
            local_70 = TwineKind;
          }
          CVar3._4_4_ = uStack_7c;
          CVar3.decUI = local_80;
          CVar6.twine = (Twine *)&local_80;
          if (cStack_6f == '\x01') {
            CVar6 = CVar3;
          }
          llvm::Twine::Twine((Twine *)local_d8,CVar8,NVar7,CVar6,local_70);
        }
        llvm::Twine::Twine((Twine *)&local_98,"\'");
        if (((NodeKind)local_c8 == NullKind) || (local_88 == NullKind)) goto LAB_0013cb1a;
        if ((NodeKind)local_c8 == EmptyKind) {
          local_b8.RHSKind = cStack_87;
          local_b8.LHSKind = local_88;
          local_b8._18_6_ = uStack_86;
        }
        else {
          if (local_88 != EmptyKind) {
            LHS._4_4_ = local_d8[0]._4_4_;
            LHS.decUI = local_d8[0].decUI;
            NVar7 = (NodeKind)local_c8;
            if (local_c8._1_1_ != EmptyKind) {
              LHS.twine = (Twine *)local_d8;
              NVar7 = TwineKind;
            }
            if (cStack_87 != '\x01') {
              local_88 = TwineKind;
            }
            CVar2._4_4_ = uStack_94;
            CVar2.decUI = local_98;
            CVar6.twine = (Twine *)&local_98;
            if (cStack_87 == '\x01') {
              CVar6 = CVar2;
            }
            goto LAB_0013c932;
          }
          local_b8.LHSKind = (NodeKind)local_c8;
          local_b8.RHSKind = local_c8._1_1_;
          local_b8._18_6_ = uStack_c6;
        }
        goto LAB_0013cb3b;
      }
      bVar5 = true;
    }
    this->controlEnabled = bVar5;
    bVar5 = true;
  }
  else {
    llvm::Twine::Twine((Twine *)local_d8,"unexpected attribute: \'",&local_50);
    llvm::Twine::Twine((Twine *)local_f8,"\'");
    if (((NodeKind)local_c8 == NullKind) || ((NodeKind)local_e8 == NullKind)) {
LAB_0013cb1a:
      local_b8._16_2_ = 0x100;
    }
    else if ((NodeKind)local_c8 == EmptyKind) {
      local_b8.LHSKind = (NodeKind)local_e8;
      local_b8.RHSKind = local_e8._1_1_;
      local_b8._18_6_ = uStack_e6;
    }
    else if ((NodeKind)local_e8 == EmptyKind) {
      local_b8.LHSKind = (NodeKind)local_c8;
      local_b8.RHSKind = local_c8._1_1_;
      local_b8._18_6_ = uStack_c6;
    }
    else {
      LHS._4_4_ = local_d8[0]._4_4_;
      LHS.decUI = local_d8[0].decUI;
      NVar7 = (NodeKind)local_c8;
      if (local_c8._1_1_ != EmptyKind) {
        LHS.twine = (Twine *)local_d8;
        NVar7 = TwineKind;
      }
      local_88 = (NodeKind)local_e8;
      if (local_e8._1_1_ != EmptyKind) {
        local_88 = TwineKind;
      }
      CVar1._4_4_ = local_f8[0]._4_4_;
      CVar1.decUI = local_f8[0].decUI;
      CVar6.twine = (Twine *)local_f8;
      if (local_e8._1_1_ == EmptyKind) {
        CVar6 = CVar1;
      }
LAB_0013c932:
      llvm::Twine::Twine(&local_b8,LHS,NVar7,CVar6,local_88);
    }
LAB_0013cb3b:
    llbuild::buildsystem::ConfigureContext::error(ctx,&local_b8);
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext& ctx, StringRef name,
                                  StringRef value) override {
    if (name == "control-enabled") {
      if (value != "true" && value != "false") {
        ctx.error("invalid value: '" + value + "' for attribute '" +
                  name + "'");
        return false;
      }
      controlEnabled = (value == "true");
    } else {
      ctx.error("unexpected attribute: '" + name + "'");
      return false;
    }
    return true;
  }